

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

bool __thiscall
google::protobuf::stringpiece_internal::StringPiece::Consume(StringPiece *this,StringPiece x)

{
  bool bVar1;
  
  bVar1 = starts_with(this,x);
  if (bVar1) {
    this->ptr_ = this->ptr_ + x.length_;
    this->length_ = this->length_ - x.length_;
  }
  return bVar1;
}

Assistant:

bool StringPiece::Consume(StringPiece x) {
  if (starts_with(x)) {
    ptr_ += x.length_;
    length_ -= x.length_;
    return true;
  }
  return false;
}